

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O3

int GetExpressScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,double *pDistances,double *pAngles,BOOL *pbNewScan)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  double dVar4;
  ushort uVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  uchar *puVar14;
  uchar *puVar15;
  byte bVar16;
  double dVar17;
  double dVar18;
  uchar databuf [84];
  uchar local_88 [2];
  byte bStack_86;
  byte bStack_85;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  bVar16 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  _local_88 = 0;
  uStack_80 = 0;
  local_38 = 0;
  iVar7 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,local_88,0x54);
  iVar8 = 1;
  if (iVar7 == 0) {
    bVar2 = pRPLIDAR->esdata_prev[3];
    bVar3 = pRPLIDAR->esdata_prev[2];
    *pbNewScan = (uint)(bVar2 >> 7);
    dVar18 = (double)((uint)bVar3 | (bVar2 & 0x7f) << 8) * 0.015625;
    dVar17 = (double)((uint)bStack_86 | (bStack_85 & 0x7f) << 8) * 0.015625;
    dVar17 = (double)(~-(ulong)(dVar17 < dVar18) & (ulong)dVar17 |
                     (ulong)(dVar17 + 360.0) & -(ulong)(dVar17 < dVar18)) - dVar18;
    puVar15 = pRPLIDAR->esdata_prev + 8;
    lVar10 = 0;
    do {
      uVar5 = *(ushort *)(puVar15 + -4);
      bVar2 = puVar15[-1];
      bVar3 = puVar15[-6];
      bVar6 = (puVar15[-4] & 3) << 4;
      bVar12 = *puVar15 & 0xf;
      bVar11 = puVar15[-2] << 4;
      bVar9 = *puVar15 >> 4;
      bVar13 = (bVar12 | bVar6 & 0x1f) + 1;
      if (bVar6 < 0x20) {
        bVar13 = bVar12 | bVar6;
      }
      bVar6 = (bVar9 | bVar11 & 0x1f) + 1;
      if ((bVar11 & 0x30) < 0x20) {
        bVar6 = bVar9 | bVar11 & 0x3f;
      }
      lVar1 = lVar10 + 2;
      dVar4 = fmod(((((double)((int)lVar10 + 1) * dVar17 * 0.03125 + dVar18) -
                    (double)bVar13 * 0.125) * -3.141592653589793) / 180.0,6.283185307179586);
      dVar4 = fmod(dVar4 + 9.42477796076938,6.283185307179586);
      pAngles[lVar10] = dVar4 + -3.141592653589793;
      dVar4 = fmod(((((double)(int)lVar1 * dVar17 * 0.03125 + dVar18) - (double)bVar6 * 0.125) *
                   -3.141592653589793) / 180.0,6.283185307179586);
      dVar4 = fmod(dVar4 + 9.42477796076938,6.283185307179586);
      pAngles[lVar10 + 1] = dVar4 + -3.141592653589793;
      pDistances[lVar10] = (double)(uVar5 >> 2) / 1000.0;
      pDistances[lVar10 + 1] = (double)(ushort)(CONCAT11(bVar2,bVar3) >> 2) / 1000.0;
      puVar15 = puVar15 + 5;
      lVar10 = lVar1;
    } while (lVar1 != 0x20);
    puVar15 = local_88;
    puVar14 = pRPLIDAR->esdata_prev;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined8 *)puVar14 = *(undefined8 *)puVar15;
      puVar15 = puVar15 + ((ulong)bVar16 * -2 + 1) * 8;
      puVar14 = puVar14 + (ulong)bVar16 * -0x10 + 8;
    }
    *(undefined4 *)(pRPLIDAR->esdata_prev + 0x50) = local_38;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

inline int GetExpressScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, double* pDistances, double* pAngles, BOOL* pbNewScan)
{
	int j = 0;

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT	
#if !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	sl_lidar_response_measurement_node_hq_t nodes[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR+MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR];
#else
	sl_lidar_response_measurement_node_hq_t nodes[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
#endif // !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	size_t nodesCount = sizeof(nodes)/sizeof(sl_lidar_response_measurement_node_hq_t);
	size_t nodesRead = 0;
	int nbMeasurements = NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;
	CHRONO chrono;

	StartChrono(&chrono);

	if (!pRPLIDAR->nodes_cache->empty())
	{
		for (j = 0; j < min(nbMeasurements, (int)pRPLIDAR->nodes_cache->size()); j++)
		{
			nodes[j] = pRPLIDAR->nodes_cache->front();
			pRPLIDAR->nodes_cache->pop_front();
		}
		nodesRead = min(nbMeasurements, (int)pRPLIDAR->nodes_cache->size());
	}
	while ((int)nodesRead < nbMeasurements)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > pRPLIDAR->timeout)
		{
			printf("A RPLIDAR is not responding correctly : getScanDataWithIntervalHq() timeout. \n");
			return EXIT_TIMEOUT;
		}
		nodesCount = nbMeasurements-nodesRead;
		if (SL_IS_FAIL(pRPLIDAR->drv->getScanDataWithIntervalHq(nodes+nodesRead, nodesCount)))
		{
			uSleep(1000);
		}
		else nodesRead += nodesCount;
	}
	if ((int)nodesRead > nbMeasurements)
	{
		for (j = nbMeasurements; j < (int)nodesRead; j++)
		{
			pRPLIDAR->nodes_cache->push_back(nodes[j]);
		}
	}

	// Analyze the data response.
	*pbNewScan = 0;

	//memset(pAngles, 0, nbMeasurements*sizeof(double));
	//memset(pDistances, 0, nbMeasurements*sizeof(double));
	for (j = 0; j < nbMeasurements; j++)
	{
		*pbNewScan = (*pbNewScan) | (nodes[j].flag & SL_LIDAR_RESP_MEASUREMENT_SYNCBIT);

		// Convert in rad.
		pAngles[j] = fmod_2PI_deg2rad(-nodes[j].angle_z_q14*90.0/(1 << 14));

		// Convert in m.
		pDistances[j] = nodes[j].dist_mm_q2/4000.0;
	}
#else
	unsigned char databuf[NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
	unsigned short start_angle_q6 = 0;
	unsigned short start_angle_q6_prev = 0;
	unsigned short distance1 = 0;
	unsigned short distance2 = 0;
	char dtheta1_q3 = 0;
	char dtheta2_q3 = 0;
	double dtheta1 = 0;
	double dtheta2 = 0;
	double theta1 = 0;
	double theta2 = 0;

	// Receive the data response.
	memset(databuf, 0, sizeof(databuf));
	if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, databuf, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	start_angle_q6 = ((databuf[3] & 0x7F)<<8) | databuf[2];

	// Analyze the previous data response.
	start_angle_q6_prev = ((pRPLIDAR->esdata_prev[3] & 0x7F)<<8) | pRPLIDAR->esdata_prev[2];
	*pbNewScan = pRPLIDAR->esdata_prev[3]>>7;

	//memset(pAngles, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
	//memset(pDistances, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
	for (j = 0; j < NB_CABINS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; j++)
	{
		distance1 = ((pRPLIDAR->esdata_prev[4+5*j+1]<<8)|pRPLIDAR->esdata_prev[4+5*j+0])>>2;
		distance2 = ((pRPLIDAR->esdata_prev[4+5*j+3]<<8)|pRPLIDAR->esdata_prev[5*j+2])>>2;
		dtheta1_q3 = ((pRPLIDAR->esdata_prev[4+5*j+0] & 0x03)<<4)|(pRPLIDAR->esdata_prev[4+5*j+4] & 0x0F);
		dtheta2_q3 = ((pRPLIDAR->esdata_prev[4+5*j+2] & 0x03)<<4)|(pRPLIDAR->esdata_prev[4+5*j+4]>>4);
		// Handle the sign bit...
		dtheta1 = ((dtheta1_q3 & 0x20)>>5)? (-~(dtheta1_q3 & 0x1F))/8.0: (dtheta1_q3 & 0x1F)/8.0;
		dtheta2 = ((dtheta2_q3 & 0x20)>>5)? (-~(dtheta2_q3 & 0x1F))/8.0: (dtheta2_q3 & 0x1F)/8.0;

		// k indexes in the formula of the documentation start at 1...
		theta1 = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*(2*j+1)/(NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)-dtheta1;
		theta2 = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*(2*j+2)/(NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)-dtheta2;

		// Convert in rad.
		pAngles[2*j+0] = fmod_2PI_deg2rad(-theta1);
		pAngles[2*j+1] = fmod_2PI_deg2rad(-theta2);

		// Convert in m.
		pDistances[2*j+0] = distance1/1000.0;
		pDistances[2*j+1] = distance2/1000.0;
	}

	memcpy(pRPLIDAR->esdata_prev, databuf, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}